

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unordered_map.h
# Opt level: O0

const_iterator __thiscall
frozen::unordered_map<frozen::basic_string<char>,int,3ul,frozen::elsa<void>,eq>::
find<std::__cxx11::string>
          (unordered_map<frozen::basic_string<char>,int,3ul,frozen::elsa<void>,eq> *this,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *key)

{
  hasher *hash;
  key_equal *equal;
  const_iterator pvVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *key_local;
  unordered_map<frozen::basic_string<char>,_int,_3UL,_frozen::elsa<void>,_eq> *this_local;
  
  hash = unordered_map<frozen::basic_string<char>,_int,_3UL,_frozen::elsa<void>,_eq>::hash_function
                   ((unordered_map<frozen::basic_string<char>,_int,_3UL,_frozen::elsa<void>,_eq> *)
                    this);
  equal = unordered_map<frozen::basic_string<char>,_int,_3UL,_frozen::elsa<void>,_eq>::key_eq
                    ((unordered_map<frozen::basic_string<char>,_int,_3UL,_frozen::elsa<void>,_eq> *)
                     this);
  pvVar1 = find_impl<frozen::unordered_map<frozen::basic_string<char>,int,3ul,frozen::elsa<void>,eq>const&,std::__cxx11::string,frozen::elsa<void>,eq>
                     ((unordered_map<frozen::basic_string<char>,_int,_3UL,_frozen::elsa<void>,_eq> *
                      )this,key,hash,equal);
  return pvVar1;
}

Assistant:

constexpr const_iterator find(KeyType const &key) const {
    return find_impl(*this, key, hash_function(), key_eq());
  }